

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PorterCb(void *pCtx,int tflags,char *pToken,int nToken,int iStart,int iEnd)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar6;
  byte *pbVar7;
  byte bVar8;
  char *zStem;
  uint uVar9;
  short *psVar10;
  undefined4 in_register_00000034;
  char *pcVar11;
  char *pcVar12;
  undefined8 uVar13;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  ulong uVar14;
  int nBuf;
  int nStem;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint nStem_00;
  uint uVar18;
  size_t sStack_60;
  
  uVar14 = CONCAT44(in_register_0000008c,iEnd);
  uVar16 = CONCAT44(in_register_00000084,iStart);
  uVar17 = CONCAT44(in_register_00000034,tflags);
  if (nToken - 0x41U < 0xffffffc2) {
    uVar13 = *pCtx;
    UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
    uVar6 = (ulong)(uint)nToken;
    zStem = pToken;
    goto LAB_0019bdcd;
  }
  zStem = *(char **)((long)pCtx + 0x10);
  uVar17 = (ulong)(uint)nToken;
  memcpy(zStem,pToken,uVar17);
  if (zStem[nToken - 1U] == 's') {
    uVar6 = (ulong)(nToken - 2);
    if (zStem[uVar6] == 's') goto LAB_0019b23a;
    if (zStem[uVar6] == 'e') {
      if ((uint)nToken < 5) {
        if (nToken == 4) {
          uVar17 = 4;
          goto LAB_0019b248;
        }
        goto LAB_0019b250;
      }
      if ((zStem[uVar17 - 4] != 's') || (zStem[uVar17 - 3] != 's')) {
LAB_0019b248:
        if (zStem[uVar17 - 3] != 'i') goto LAB_0019b250;
      }
    }
    else {
LAB_0019b250:
      uVar6 = (ulong)(nToken - 1U);
    }
  }
  else {
LAB_0019b23a:
    uVar6 = (ulong)(uint)nToken;
  }
  uVar9 = (uint)uVar6;
  uVar17 = (ulong)(uVar9 - 2);
  if (zStem[uVar17] == 'n') {
    if (3 < uVar9) {
      uVar17 = (ulong)(uVar9 - 3);
      iVar5 = bcmp("ing",zStem + uVar17,3);
      if (iVar5 == 0) {
LAB_0019b2ea:
        uVar9 = (uint)uVar17;
        iVar5 = fts5Porter_Vowel(zStem,uVar9);
        if (iVar5 != 0) {
          pcVar11 = zStem + uVar17;
          pbVar7 = (byte *)(pcVar11 + -2);
          bVar2 = *pbVar7;
          if (bVar2 == 0x69) {
            if ((2 < uVar9) && (*(short *)pbVar7 == 0x7a69)) {
              *pcVar11 = 'e';
              pbVar7[0] = 0x69;
              pbVar7[1] = 0x7a;
              goto LAB_0019b3c6;
            }
          }
          else if (bVar2 == 0x62) {
            if ((2 < uVar9) && (*(short *)pbVar7 == 0x6c62)) {
              *pcVar11 = 'e';
              pbVar7[0] = 0x62;
              pbVar7[1] = 0x6c;
              goto LAB_0019b3c6;
            }
          }
          else if (((bVar2 == 0x61) && (2 < uVar9)) && (*(short *)pbVar7 == 0x7461)) {
            *pcVar11 = 'e';
            pbVar7[0] = 0x61;
            pbVar7[1] = 0x74;
LAB_0019b3c6:
            uVar6 = (ulong)(uVar9 + 1);
            goto LAB_0019b3ca;
          }
          bVar3 = (zStem + uVar17)[-1];
          bVar8 = (byte)(bVar3 + 0x9f) >> 1 | (bVar3 + 0x9f) * -0x80;
          if ((((bVar8 < 0xb) && ((0x495U >> (bVar8 & 0x1f) & 1) != 0)) ||
              ((bVar3 - 0x6c < 0xf && ((0x4081U >> (bVar3 - 0x6c & 0x1f) & 1) != 0)))) ||
             (bVar3 != bVar2)) {
            iVar5 = fts5Porter_MEq1(zStem,uVar9);
            uVar6 = uVar17;
            if ((iVar5 != 0) && (iVar5 = fts5Porter_Ostar(zStem,uVar9), iVar5 != 0)) {
              uVar6 = (ulong)(uVar9 + 1);
              zStem[uVar17] = 'e';
            }
          }
          else {
            uVar6 = (ulong)(uVar9 - 1);
          }
        }
      }
    }
  }
  else if (zStem[uVar17] == 'e') {
    if (uVar9 < 4) {
      if (uVar9 == 3) goto LAB_0019b2db;
      uVar6 = 2;
    }
    else {
      pcVar11 = zStem + (uVar9 - 3);
      iVar5 = bcmp("eed",pcVar11,3);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar9 - 3);
        if (iVar5 != 0) {
          pcVar11[0] = 'e';
          pcVar11[1] = 'e';
          uVar6 = (ulong)(uVar9 - 1);
        }
      }
      else {
LAB_0019b2db:
        if (*(short *)(zStem + uVar17) == 0x6465) goto LAB_0019b2ea;
      }
    }
  }
LAB_0019b3ca:
  uVar9 = (uint)uVar6;
  uVar17 = (long)(int)uVar9 - 1;
  if ((zStem[(long)(int)uVar9 + -1] == 'y') &&
     (iVar5 = fts5Porter_Vowel(zStem,(int)uVar17), iVar5 != 0)) {
    zStem[uVar6 - 1] = 'i';
  }
  switch(zStem[uVar6 - 2]) {
  case 'a':
    if (uVar9 < 8) {
      if (uVar9 == 7) goto LAB_0019b76c;
    }
    else {
      pcVar11 = zStem + (uVar9 - 7);
      iVar5 = bcmp("ational",pcVar11,7);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar9 - 7);
        if (iVar5 != 0) {
          pcVar11[2] = 'e';
          pcVar11[0] = 'a';
          pcVar11[1] = 't';
          goto LAB_0019b992;
        }
      }
      else {
LAB_0019b76c:
        uVar18 = uVar9 - 6;
        iVar5 = bcmp("tional",zStem + uVar18,6);
        if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar18), iVar5 != 0)) {
          builtin_strncpy(zStem + uVar18,"tion",4);
          goto LAB_0019b973;
        }
      }
    }
    break;
  case 'c':
    if (4 < uVar9) {
      uVar9 = uVar9 - 4;
      piVar1 = (int *)(zStem + uVar9);
      if (*(int *)(zStem + uVar9) == 0x69636e65) {
        iVar5 = fts5Porter_MGt0(zStem,uVar9);
        if (iVar5 != 0) {
          *piVar1 = 0x65636e65;
        }
      }
      else if ((*piVar1 == 0x69636e61) && (iVar5 = fts5Porter_MGt0(zStem,uVar9), iVar5 != 0)) {
        *piVar1 = 0x65636e61;
      }
    }
    break;
  case 'e':
    if (4 < uVar9) {
      uVar9 = uVar9 - 4;
      if ((*(int *)(zStem + uVar9) == 0x72657a69) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar9), iVar5 != 0)) {
        pcVar11 = zStem + uVar9;
        pcVar11[2] = 'e';
        pcVar11[0] = 'i';
        pcVar11[1] = 'z';
LAB_0019b7e9:
        uVar6 = uVar17 & 0xffffffff;
      }
    }
    break;
  case 'g':
    if (4 < uVar9) {
      uVar9 = uVar9 - 4;
      if ((*(int *)(zStem + uVar9) == 0x69676f6c) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar9), iVar5 != 0)) {
        pcVar11 = zStem + uVar9;
        pcVar11[2] = 'g';
        pcVar11[0] = 'l';
        pcVar11[1] = 'o';
        goto LAB_0019b7e9;
      }
    }
    break;
  case 'l':
    if (3 < uVar9) {
      uVar18 = uVar9 - 3;
      pcVar11 = zStem + uVar18;
      iVar5 = bcmp("bli",pcVar11,3);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar18);
        if (iVar5 != 0) {
          pcVar11[2] = 'e';
          pcVar11[0] = 'b';
          pcVar11[1] = 'l';
        }
      }
      else {
        if (uVar9 == 4) {
LAB_0019b7f1:
          bVar4 = false;
        }
        else {
          nStem_00 = uVar9 - 4;
          if (*(int *)(zStem + nStem_00) == 0x696c6c61) {
            iVar5 = fts5Porter_MGt0(zStem,nStem_00);
            if (iVar5 == 0) break;
            (zStem + nStem_00)[0] = 'a';
            (zStem + nStem_00)[1] = 'l';
            goto LAB_0019b973;
          }
          if (uVar9 < 6) goto LAB_0019b7f1;
          pcVar12 = zStem + (uVar9 - 5);
          iVar5 = bcmp("entli",pcVar12,5);
          bVar4 = true;
          if (iVar5 == 0) {
            iVar5 = fts5Porter_MGt0(zStem,uVar9 - 5);
            if (iVar5 != 0) {
              pcVar12[2] = 't';
              pcVar12[0] = 'e';
              pcVar12[1] = 'n';
              goto LAB_0019b973;
            }
            break;
          }
        }
        iVar5 = bcmp("eli",pcVar11,3);
        if (iVar5 == 0) {
          iVar5 = fts5Porter_MGt0(zStem,uVar18);
          if (iVar5 != 0) {
            *pcVar11 = 'e';
LAB_0019b973:
            uVar6 = (ulong)(uVar9 - 2);
          }
        }
        else if (bVar4) {
          pcVar11 = zStem + (uVar9 - 5);
          iVar5 = bcmp("ousli",pcVar11,5);
          if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar9 - 5), iVar5 != 0)) {
            pcVar11[2] = 's';
            pcVar11[0] = 'o';
            pcVar11[1] = 'u';
            goto LAB_0019b973;
          }
        }
      }
    }
    break;
  case 'o':
    if (uVar9 < 8) {
      if (5 < uVar9) goto LAB_0019b723;
      if (uVar9 != 5) break;
LAB_0019b7b7:
      uVar9 = uVar9 - 4;
      if ((*(int *)(zStem + uVar9) == 0x726f7461) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar9), iVar5 != 0)) {
        pcVar11 = zStem + uVar9;
        pcVar11[2] = 'e';
        pcVar11[0] = 'a';
        pcVar11[1] = 't';
        goto LAB_0019b7e9;
      }
    }
    else {
      pcVar11 = zStem + (uVar9 - 7);
      iVar5 = bcmp("ization",pcVar11,7);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar9 - 7);
        if (iVar5 != 0) {
          pcVar11[2] = 'e';
          pcVar11[0] = 'i';
          pcVar11[1] = 'z';
          goto LAB_0019b992;
        }
      }
      else {
LAB_0019b723:
        pcVar11 = zStem + (uVar9 - 5);
        iVar5 = bcmp("ation",pcVar11,5);
        if (iVar5 != 0) goto LAB_0019b7b7;
        iVar5 = fts5Porter_MGt0(zStem,uVar9 - 5);
        if (iVar5 != 0) {
          pcVar11[2] = 'e';
          pcVar11[0] = 'a';
          pcVar11[1] = 't';
          goto LAB_0019b973;
        }
      }
    }
    break;
  case 's':
    if (5 < uVar9) {
      pcVar11 = zStem + (uVar9 - 5);
      iVar5 = bcmp("alism",pcVar11,5);
      if (iVar5 == 0) {
LAB_0019b886:
        iVar5 = fts5Porter_MGt0(zStem,uVar9 - 5);
        if (iVar5 != 0) {
          pcVar11[0] = 'a';
          pcVar11[1] = 'l';
LAB_0019b89a:
          uVar6 = (ulong)(uVar9 - 3);
        }
      }
      else if (7 < uVar9) {
        uVar18 = uVar9 - 7;
        pcVar11 = zStem + uVar18;
        iVar5 = bcmp("iveness",pcVar11,7);
        if (iVar5 == 0) {
          iVar5 = fts5Porter_MGt0(zStem,uVar18);
          if (iVar5 != 0) {
            pcVar11[2] = 'e';
            pcVar11[0] = 'i';
            pcVar11[1] = 'v';
            goto LAB_0019b992;
          }
        }
        else {
          iVar5 = bcmp("fulness",pcVar11,7);
          if (iVar5 == 0) {
            iVar5 = fts5Porter_MGt0(zStem,uVar18);
            if (iVar5 != 0) {
              pcVar11[2] = 'l';
              pcVar11[0] = 'f';
              pcVar11[1] = 'u';
              goto LAB_0019b992;
            }
          }
          else {
            iVar5 = bcmp("ousness",pcVar11,7);
            if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar18), iVar5 != 0)) {
              pcVar11[2] = 's';
              pcVar11[0] = 'o';
              pcVar11[1] = 'u';
LAB_0019b992:
              uVar6 = (ulong)(uVar9 - 4);
            }
          }
        }
      }
    }
    break;
  case 't':
    if (5 < uVar9) {
      pcVar11 = zStem + (uVar9 - 5);
      iVar5 = bcmp("aliti",pcVar11,5);
      if (iVar5 == 0) goto LAB_0019b886;
      iVar5 = bcmp("iviti",pcVar11,5);
      if (iVar5 == 0) {
        iVar5 = fts5Porter_MGt0(zStem,uVar9 - 5);
        if (iVar5 != 0) {
          pcVar11[2] = 'e';
          pcVar11[0] = 'i';
          pcVar11[1] = 'v';
          goto LAB_0019b973;
        }
      }
      else if (uVar9 == 6) {
        uVar6 = 6;
      }
      else {
        pcVar11 = zStem + (uVar9 - 6);
        iVar5 = bcmp("biliti",pcVar11,6);
        if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar9 - 6), iVar5 != 0)) {
          pcVar11[2] = 'e';
          pcVar11[0] = 'b';
          pcVar11[1] = 'l';
          goto LAB_0019b89a;
        }
      }
    }
  }
  uVar9 = (uint)uVar6;
  switch(zStem[uVar6 - 2]) {
  case 's':
    if ((4 < uVar9) && (uVar17 = (ulong)(uVar9 - 4), *(int *)(zStem + uVar17) == 0x7373656e)) {
LAB_0019baf9:
      iVar5 = fts5Porter_MGt0(zStem,(int)uVar17);
      if (iVar5 != 0) {
LAB_0019bb08:
        uVar6 = uVar17;
      }
    }
    break;
  case 't':
    if (5 < uVar9) {
      pcVar11 = zStem + (uVar9 - 5);
      iVar5 = bcmp("icate",pcVar11,5);
      if (((iVar5 == 0) || (iVar5 = bcmp("iciti",pcVar11,5), iVar5 == 0)) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar9 - 5), iVar5 != 0)) {
        pcVar11[0] = 'i';
        pcVar11[1] = 'c';
LAB_0019bad1:
        uVar9 = uVar9 - 3;
LAB_0019bad4:
        uVar17 = (ulong)uVar9;
        goto LAB_0019bb08;
      }
    }
    break;
  case 'u':
    if (3 < uVar9) {
      uVar9 = uVar9 - 3;
      pcVar11 = "ful";
      sStack_60 = 3;
LAB_0019baef:
      uVar17 = (ulong)uVar9;
      iVar5 = bcmp(pcVar11,zStem + uVar17,sStack_60);
      if (iVar5 == 0) goto LAB_0019baf9;
    }
    break;
  case 'v':
    if (5 < uVar9) {
      uVar9 = uVar9 - 5;
      pcVar11 = "ative";
      sStack_60 = 5;
      goto LAB_0019baef;
    }
    break;
  case 'w':
  case 'x':
  case 'y':
    break;
  case 'z':
    if (5 < uVar9) {
      pcVar11 = zStem + (uVar9 - 5);
      iVar5 = bcmp("alize",pcVar11,5);
      if ((iVar5 == 0) && (iVar5 = fts5Porter_MGt0(zStem,uVar9 - 5), iVar5 != 0)) {
        pcVar11[0] = 'a';
        pcVar11[1] = 'l';
        goto LAB_0019bad1;
      }
    }
    break;
  default:
    if ((zStem[uVar6 - 2] == 'a') && (4 < uVar9)) {
      uVar18 = uVar9 - 4;
      if ((*(int *)(zStem + uVar18) == 0x6c616369) &&
         (iVar5 = fts5Porter_MGt0(zStem,uVar18), iVar5 != 0)) {
        (zStem + uVar18)[0] = 'i';
        (zStem + uVar18)[1] = 'c';
        uVar9 = uVar9 - 2;
        goto LAB_0019bad4;
      }
    }
  }
  uVar9 = (uint)uVar6;
  lVar15 = (long)(int)uVar9;
  if (0x19 < (byte)zStem[lVar15 + -2] - 0x61) goto switchD_0019bb3a_caseD_62;
  psVar10 = (short *)(zStem + lVar15 + -2);
  uVar16 = lVar15 - 2;
  uVar17 = uVar16;
  switch((uint)(byte)zStem[lVar15 + -2]) {
  case 0x61:
    if ((uVar9 < 3) || (*psVar10 != 0x6c61)) break;
LAB_0019be2a:
    iVar5 = fts5Porter_MGt1(zStem,(int)uVar17);
LAB_0019be35:
    if (iVar5 != 0) goto LAB_0019be41;
    goto LAB_0019bd6a;
  case 99:
    if (4 < uVar9) {
      uVar17 = (ulong)(uVar9 - 4);
      if ((*(int *)(zStem + uVar17) != 0x65636e61) && (*(int *)(zStem + uVar17) != 0x65636e65))
      goto LAB_0019bd6a;
LAB_0019bd0d:
      iVar5 = fts5Porter_MGt1(zStem,(int)uVar17);
      if (iVar5 == 0) goto LAB_0019bd6a;
LAB_0019be41:
      uVar6 = uVar17 & 0xffffffff;
      goto LAB_0019bd6a;
    }
    break;
  case 0x65:
    if ((2 < uVar9) && (*psVar10 == 0x7265)) goto LAB_0019be2a;
    break;
  case 0x69:
    if ((2 < uVar9) && (*psVar10 == 0x6369)) goto LAB_0019be2a;
    break;
  case 0x6c:
    if (4 < uVar9) {
      uVar17 = (ulong)(uVar9 - 4);
      if ((*(int *)(zStem + uVar17) == 0x656c6261) || (*(int *)(zStem + uVar17) == 0x656c6269))
      goto LAB_0019bd0d;
      goto LAB_0019bd6a;
    }
    break;
  case 0x6e:
    if (3 < uVar9) {
      uVar16 = (ulong)(uVar9 - 3);
      pcVar11 = zStem + uVar16;
      iVar5 = bcmp("ant",pcVar11,3);
      uVar17 = uVar16;
      if (iVar5 == 0) goto LAB_0019be2a;
      if (5 < uVar9) {
        uVar17 = (ulong)(uVar9 - 5);
        iVar5 = bcmp("ement",zStem + uVar17,5);
        if (iVar5 != 0) goto LAB_0019be02;
LAB_0019be49:
        iVar5 = fts5Porter_MGt1(zStem,(int)uVar17);
        goto LAB_0019be35;
      }
      if (uVar9 != 4) {
LAB_0019be02:
        uVar17 = (ulong)(uVar9 - 4);
        if (*(int *)(zStem + uVar17) == 0x746e656d) goto LAB_0019be49;
      }
      pcVar12 = "ent";
LAB_0019be17:
      iVar5 = bcmp(pcVar12,pcVar11,3);
      uVar17 = uVar16;
      if (iVar5 == 0) goto LAB_0019be2a;
    }
    break;
  case 0x6f:
    if (uVar9 < 4) {
      if (uVar9 == 3) goto LAB_0019bd5a;
    }
    else {
      uVar17 = (ulong)(uVar9 - 3);
      iVar5 = bcmp("ion",zStem + uVar17,3);
      if (iVar5 == 0) {
        if (1 < (byte)((zStem + uVar17)[-1] + 0x8dU)) break;
        iVar5 = fts5Porter_MGt1(zStem,uVar9 - 3);
        goto LAB_0019be35;
      }
LAB_0019bd5a:
      uVar17 = uVar16;
      if (*psVar10 == 0x756f) goto LAB_0019be2a;
    }
    break;
  case 0x73:
    if (3 < uVar9) {
      uVar17 = (ulong)(uVar9 - 3);
      pcVar11 = zStem + uVar17;
      pcVar12 = "ism";
LAB_0019bcfd:
      iVar5 = bcmp(pcVar12,pcVar11,3);
      if (iVar5 == 0) goto LAB_0019bd0d;
      goto LAB_0019bd6a;
    }
    break;
  case 0x74:
    if (3 < uVar9) {
      uVar16 = (ulong)(uVar9 - 3);
      pcVar11 = zStem + uVar16;
      iVar5 = bcmp("ate",pcVar11,3);
      uVar17 = uVar16;
      if (iVar5 == 0) goto LAB_0019be2a;
      pcVar12 = "iti";
      goto LAB_0019be17;
    }
    break;
  case 0x75:
    if (3 < uVar9) {
      uVar17 = (ulong)(uVar9 - 3);
      pcVar11 = zStem + uVar17;
      pcVar12 = "ous";
      goto LAB_0019bcfd;
    }
    break;
  case 0x76:
    if (3 < uVar9) {
      uVar17 = (ulong)(uVar9 - 3);
      pcVar11 = zStem + uVar17;
      pcVar12 = "ive";
      goto LAB_0019bcfd;
    }
    break;
  case 0x7a:
    if (3 < uVar9) {
      uVar17 = (ulong)(uVar9 - 3);
      pcVar11 = zStem + uVar17;
      pcVar12 = "ize";
      goto LAB_0019bcfd;
    }
  }
switchD_0019bb3a_caseD_62:
LAB_0019bd6a:
  if (zStem[(long)(int)uVar6 + -1] == 'e') {
    uVar17 = (long)(int)uVar6 - 1;
    nStem = (int)uVar17;
    iVar5 = fts5Porter_MGt1(zStem,nStem);
    if ((iVar5 != 0) ||
       ((iVar5 = fts5Porter_MEq1(zStem,nStem), iVar5 != 0 &&
        (iVar5 = fts5Porter_Ostar(zStem,nStem), iVar5 == 0)))) {
      uVar6 = uVar17 & 0xffffffff;
    }
  }
  if ((((1 < (int)uVar6) && (uVar9 = (int)uVar6 - 1, zStem[uVar9] == 'l')) &&
      (zStem[uVar6 - 2] == 'l')) && (iVar5 = fts5Porter_MGt1(zStem,uVar9), iVar5 != 0)) {
    uVar6 = (ulong)uVar9;
  }
  uVar13 = *pCtx;
  UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
  uVar17 = (ulong)(uint)tflags;
  uVar16 = (ulong)(uint)iStart;
  uVar14 = (ulong)(uint)iEnd;
LAB_0019bdcd:
  iVar5 = (*UNRECOVERED_JUMPTABLE)(uVar13,uVar17,zStem,uVar6,uVar16,uVar14);
  return iVar5;
}

Assistant:

static int fts5PorterCb(
  void *pCtx, 
  int tflags,
  const char *pToken, 
  int nToken, 
  int iStart, 
  int iEnd
){
  PorterContext *p = (PorterContext*)pCtx;

  char *aBuf;
  int nBuf;

  if( nToken>FTS5_PORTER_MAX_TOKEN || nToken<3 ) goto pass_through;
  aBuf = p->aBuf;
  nBuf = nToken;
  memcpy(aBuf, pToken, nBuf);

  /* Step 1. */
  fts5PorterStep1A(aBuf, &nBuf);
  if( fts5PorterStep1B(aBuf, &nBuf) ){
    if( fts5PorterStep1B2(aBuf, &nBuf)==0 ){
      char c = aBuf[nBuf-1];
      if( fts5PorterIsVowel(c, 0)==0 
       && c!='l' && c!='s' && c!='z' && c==aBuf[nBuf-2] 
      ){
        nBuf--;
      }else if( fts5Porter_MEq1(aBuf, nBuf) && fts5Porter_Ostar(aBuf, nBuf) ){
        aBuf[nBuf++] = 'e';
      }
    }
  }

  /* Step 1C. */
  if( aBuf[nBuf-1]=='y' && fts5Porter_Vowel(aBuf, nBuf-1) ){
    aBuf[nBuf-1] = 'i';
  }

  /* Steps 2 through 4. */
  fts5PorterStep2(aBuf, &nBuf);
  fts5PorterStep3(aBuf, &nBuf);
  fts5PorterStep4(aBuf, &nBuf);

  /* Step 5a. */
  assert( nBuf>0 );
  if( aBuf[nBuf-1]=='e' ){
    if( fts5Porter_MGt1(aBuf, nBuf-1) 
     || (fts5Porter_MEq1(aBuf, nBuf-1) && !fts5Porter_Ostar(aBuf, nBuf-1))
    ){
      nBuf--;
    }
  }

  /* Step 5b. */
  if( nBuf>1 && aBuf[nBuf-1]=='l' 
   && aBuf[nBuf-2]=='l' && fts5Porter_MGt1(aBuf, nBuf-1) 
  ){
    nBuf--;
  }

  return p->xToken(p->pCtx, tflags, aBuf, nBuf, iStart, iEnd);

 pass_through:
  return p->xToken(p->pCtx, tflags, pToken, nToken, iStart, iEnd);
}